

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mctools_impl_has_winnamespace(mcu8str *path)

{
  bool local_a;
  bool local_9;
  mcu8str *path_local;
  
  local_9 = false;
  if ((((3 < path->size) && (local_9 = false, path->c_str[2] == '?')) &&
      ((*path->c_str == '/' || (local_9 = false, *path->c_str == '\\')))) &&
     ((path->c_str[1] == '/' || (local_9 = false, path->c_str[1] == '\\')))) {
    local_a = true;
    if (path->c_str[3] != '/') {
      local_a = path->c_str[3] == '\\';
    }
    local_9 = local_a;
  }
  return (int)local_9;
}

Assistant:

int mctools_impl_has_winnamespace( const mcu8str * path )
  {
    return ( path->size >= 4 && path->c_str[2] == '?'
             && ( path->c_str[0] == '/' || path->c_str[0] == '\\' )
             && ( path->c_str[1] == '/' || path->c_str[1] == '\\' )
             && ( path->c_str[3] == '/' || path->c_str[3] == '\\' ) );
  }